

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateByteSize
          (MessageGenerator *this,Printer *printer)

{
  uint uVar1;
  Printer *pPVar2;
  bool bVar3;
  int iVar4;
  MessageOptions *this_00;
  FieldGenerator *pFVar5;
  FieldDescriptor *this_01;
  FileDescriptor *pFVar6;
  int extraout_EDX;
  int i_00;
  FieldDescriptor *field_00;
  char *pcVar7;
  FieldDescriptor *field_1;
  undefined1 local_78 [4];
  int i_1;
  string local_48;
  FieldDescriptor *local_28;
  FieldDescriptor *field;
  int i;
  int last_index;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  _i = printer;
  printer_local = (Printer *)this;
  this_00 = Descriptor::options(this->descriptor_);
  bVar3 = MessageOptions::message_set_wire_format(this_00);
  if (bVar3) {
    io::Printer::Print(_i,
                       "int $classname$::ByteSize() const {\n  int total_size = _extensions_.MessageSetByteSize();\n"
                       ,"classname",&this->classname_);
    pFVar6 = Descriptor::file(this->descriptor_);
    bVar3 = HasUnknownFields(pFVar6);
    if (bVar3) {
      io::Printer::Print(_i,
                         "  total_size += ::google::protobuf::internal::WireFormat::\n      ComputeUnknownMessageSetItemsSize(unknown_fields());\n"
                        );
    }
    io::Printer::Print(_i,
                       "  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n  _cached_size_ = total_size;\n  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n  return total_size;\n}\n"
                      );
  }
  else {
    io::Printer::Print(_i,"int $classname$::ByteSize() const {\n","classname",&this->classname_);
    io::Printer::Indent(_i);
    io::Printer::Print(_i,"int total_size = 0;\n\n");
    field._4_4_ = 0xffffffff;
    for (field._0_4_ = 0; uVar1 = (uint)field, iVar4 = Descriptor::field_count(this->descriptor_),
        (int)uVar1 < iVar4; field._0_4_ = (uint)field + 1) {
      pcVar7 = (char *)(ulong)(uint)field;
      local_28 = Descriptor::field(this->descriptor_,(uint)field);
      bVar3 = FieldDescriptor::is_repeated(local_28);
      if (!bVar3) {
        iVar4 = (int)field._4_4_ % 8;
        if (((int)(uint)field / 8 != (int)field._4_4_ / 8) || ((int)field._4_4_ < 0)) {
          if (-1 < (int)field._4_4_) {
            io::Printer::Outdent(_i);
            pcVar7 = "}\n";
            io::Printer::Print(_i,"}\n");
            iVar4 = extraout_EDX;
          }
          pPVar2 = _i;
          pcVar7 = FieldDescriptor::index(local_28,pcVar7,iVar4);
          SimpleItoa_abi_cxx11_(&local_48,(protobuf *)((ulong)pcVar7 & 0xffffffff),i_00);
          io::Printer::Print(pPVar2,"if (_has_bits_[$index$ / 32] & (0xffu << ($index$ % 32))) {\n",
                             "index",&local_48);
          std::__cxx11::string::~string((string *)&local_48);
          io::Printer::Indent(_i);
        }
        field._4_4_ = (uint)field;
        anon_unknown_0::PrintFieldComment(_i,local_28);
        pPVar2 = _i;
        FieldName_abi_cxx11_((string *)local_78,(cxx *)local_28,field_00);
        io::Printer::Print(pPVar2,"if (has_$name$()) {\n","name",(string *)local_78);
        std::__cxx11::string::~string((string *)local_78);
        io::Printer::Indent(_i);
        pFVar5 = FieldGeneratorMap::get(&this->field_generators_,local_28);
        (*pFVar5->_vptr_FieldGenerator[0x11])(pFVar5,_i);
        io::Printer::Outdent(_i);
        io::Printer::Print(_i,"}\n\n");
      }
    }
    if (-1 < (int)field._4_4_) {
      io::Printer::Outdent(_i);
      io::Printer::Print(_i,"}\n");
    }
    for (field_1._4_4_ = 0; iVar4 = Descriptor::field_count(this->descriptor_),
        field_1._4_4_ < iVar4; field_1._4_4_ = field_1._4_4_ + 1) {
      this_01 = Descriptor::field(this->descriptor_,field_1._4_4_);
      bVar3 = FieldDescriptor::is_repeated(this_01);
      if (bVar3) {
        anon_unknown_0::PrintFieldComment(_i,this_01);
        pFVar5 = FieldGeneratorMap::get(&this->field_generators_,this_01);
        (*pFVar5->_vptr_FieldGenerator[0x11])(pFVar5,_i);
        io::Printer::Print(_i,"\n");
      }
    }
    iVar4 = Descriptor::extension_range_count(this->descriptor_);
    if (0 < iVar4) {
      io::Printer::Print(_i,"total_size += _extensions_.ByteSize();\n\n");
    }
    pFVar6 = Descriptor::file(this->descriptor_);
    bVar3 = HasUnknownFields(pFVar6);
    if (bVar3) {
      io::Printer::Print(_i,"if (!unknown_fields().empty()) {\n");
      io::Printer::Indent(_i);
      io::Printer::Print(_i,
                         "total_size +=\n  ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(\n    unknown_fields());\n"
                        );
      io::Printer::Outdent(_i);
      io::Printer::Print(_i,"}\n");
    }
    io::Printer::Print(_i,
                       "GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n_cached_size_ = total_size;\nGOOGLE_SAFE_CONCURRENT_WRITES_END();\nreturn total_size;\n"
                      );
    io::Printer::Outdent(_i);
    io::Printer::Print(_i,"}\n");
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateByteSize(io::Printer* printer) {
  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    printer->Print(
      "int $classname$::ByteSize() const {\n"
      "  int total_size = _extensions_.MessageSetByteSize();\n",
      "classname", classname_);
    if (HasUnknownFields(descriptor_->file())) {
      printer->Print(
        "  total_size += ::google::protobuf::internal::WireFormat::\n"
        "      ComputeUnknownMessageSetItemsSize(unknown_fields());\n");
    }
    printer->Print(
      "  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n"
      "  _cached_size_ = total_size;\n"
      "  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n"
      "  return total_size;\n"
      "}\n");
    return;
  }

  printer->Print(
    "int $classname$::ByteSize() const {\n",
    "classname", classname_);
  printer->Indent();
  printer->Print(
    "int total_size = 0;\n"
    "\n");

  int last_index = -1;

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (!field->is_repeated()) {
      // See above in GenerateClear for an explanation of this.
      // TODO(kenton):  Share code?  Unclear how to do so without
      //   over-engineering.
      if ((i / 8) != (last_index / 8) ||
          last_index < 0) {
        if (last_index >= 0) {
          printer->Outdent();
          printer->Print("}\n");
        }
        printer->Print(
          "if (_has_bits_[$index$ / 32] & (0xffu << ($index$ % 32))) {\n",
          "index", SimpleItoa(field->index()));
        printer->Indent();
      }
      last_index = i;

      PrintFieldComment(printer, field);

      printer->Print(
        "if (has_$name$()) {\n",
        "name", FieldName(field));
      printer->Indent();

      field_generators_.get(field).GenerateByteSize(printer);

      printer->Outdent();
      printer->Print(
        "}\n"
        "\n");
    }
  }

  if (last_index >= 0) {
    printer->Outdent();
    printer->Print("}\n");
  }

  // Repeated fields don't use _has_bits_ so we count them in a separate
  // pass.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (field->is_repeated()) {
      PrintFieldComment(printer, field);
      field_generators_.get(field).GenerateByteSize(printer);
      printer->Print("\n");
    }
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "total_size += _extensions_.ByteSize();\n"
      "\n");
  }

  if (HasUnknownFields(descriptor_->file())) {
    printer->Print("if (!unknown_fields().empty()) {\n");
    printer->Indent();
    printer->Print(
      "total_size +=\n"
      "  ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(\n"
      "    unknown_fields());\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  // We update _cached_size_ even though this is a const method.  In theory,
  // this is not thread-compatible, because concurrent writes have undefined
  // results.  In practice, since any concurrent writes will be writing the
  // exact same value, it works on all common processors.  In a future version
  // of C++, _cached_size_ should be made into an atomic<int>.
  printer->Print(
    "GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n"
    "_cached_size_ = total_size;\n"
    "GOOGLE_SAFE_CONCURRENT_WRITES_END();\n"
    "return total_size;\n");

  printer->Outdent();
  printer->Print("}\n");
}